

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

int __thiscall
NNTreeImpl::compareKeyKid(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *kids,int idx)

{
  QPDF *qpdf;
  bool bVar1;
  int iVar2;
  undefined8 extraout_RAX;
  QPDFObjectHandle QStack_88;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  bVar1 = QPDFObjectHandle::isArray(kids);
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems(kids);
    if (idx < iVar2) {
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_68,(int)kids);
      bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
      if (bVar1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_78,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
        QPDFObjectHandle::getArrayItem(&QStack_88,(int)kids);
        iVar2 = withinLimits(this,(QPDFObjectHandle *)&local_78,&QStack_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&QStack_88.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
        return iVar2;
      }
    }
  }
  qpdf = this->qpdf;
  std::__cxx11::to_string(&local_48,idx);
  std::operator+(&local_68,"invalid kid at index ",&local_48);
  ::error(qpdf,&this->oh,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&QStack_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
NNTreeImpl::compareKeyKid(QPDFObjectHandle& key, QPDFObjectHandle& kids, int idx)
{
    if (!(kids.isArray() && (idx < kids.getArrayNItems()) &&
          kids.getArrayItem(idx).isDictionary())) {
        QTC::TC("qpdf", "NNTree kid is invalid");
        error(qpdf, this->oh, "invalid kid at index " + std::to_string(idx));
    }
    return withinLimits(key, kids.getArrayItem(idx));
}